

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truc_policy.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
PackageTRUCChecks_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,CTransactionRef *ptx,int64_t vsize,Package *package,
          setEntries *mempool_ancestors)

{
  undefined8 *puVar1;
  Wtxid *this;
  Txid *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  size_t sVar4;
  long *plVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  pointer pcVar6;
  element_type *peVar7;
  element_type *peVar8;
  ushort uVar9;
  _Base_ptr p_Var10;
  undefined8 uVar11;
  pointer psVar12;
  long lVar13;
  pointer pCVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  long in_FS_OFFSET;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> in_package_parents;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  pointer local_e8;
  undefined1 local_e0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)mempool_ancestors;
  local_e0._0_8_ = vsize;
  FindInPackageParents
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff08,
             package,ptx);
  peVar3 = (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar3->version == 3) {
    if (vsize < 0x2711) {
      sVar4 = (mempool_ancestors->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      lVar13 = (long)local_f0 - (long)in_stack_ffffffffffffff08 >> 3;
      if ((sVar4 + lVar13) - 2 < 0xfffffffffffffffd) {
        base_blob<256u>::ToString_abi_cxx11_(&local_78,&peVar3->hash);
        base_blob<256u>::ToString_abi_cxx11_
                  (&local_98,
                   &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->m_witness_hash);
        tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                  (&local_58,(tinyformat *)"tx %s (wtxid=%s) would have too many ancestors",
                   (char *)&local_78,&local_98,pbVar15);
        goto LAB_00483aba;
      }
      if (lVar13 + sVar4 == 0) goto LAB_00483bad;
      if (1000 < vsize) {
        base_blob<256u>::ToString_abi_cxx11_(&local_78,&peVar3->hash);
        base_blob<256u>::ToString_abi_cxx11_
                  (&local_98,
                   &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->m_witness_hash);
        tinyformat::format<std::__cxx11::string,std::__cxx11::string,long,long>
                  (&local_58,
                   (tinyformat *)
                   "version=3 child tx %s (wtxid=%s) is too big: %u > %u virtual bytes",
                   (char *)&local_78,&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                   &TRUC_CHILD_MAX_VSIZE,(long *)in_stack_ffffffffffffff08);
        goto LAB_00483aba;
      }
      if (sVar4 == 0) {
        pcVar6 = (in_stack_ffffffffffffff08->_M_dataplus)._M_p;
        psVar12 = (package->
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((pointer)((long)(package->
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)psVar12 >> 4) <=
            pcVar6) {
LAB_00484170:
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            uVar11 = std::__throw_out_of_range_fmt
                               (
                               "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               );
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            if (in_stack_ffffffffffffff08 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              operator_delete(in_stack_ffffffffffffff08,
                              (long)local_e8 - (long)in_stack_ffffffffffffff08);
            }
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              _Unwind_Resume(uVar11);
            }
          }
          goto LAB_004843bc;
        }
        psVar12 = psVar12 + (long)pcVar6;
        bVar16 = false;
      }
      else {
        psVar12 = *(pointer *)
                   ((mempool_ancestors->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left + 1);
        bVar16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1 <
                 psVar12[0xc].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
      }
      peVar7 = (psVar12->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this = &peVar7->m_witness_hash;
      this_00 = &peVar7->hash;
      if (peVar7->version == 3) {
        for (psVar12 = (package->
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
            psVar12 !=
            (package->
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            )._M_impl.super__Vector_impl_data._M_finish; psVar12 = psVar12 + 1) {
          peVar8 = (psVar12->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          if (peVar8 != peVar3) {
            for (pCVar14 = (peVar8->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start;
                pCVar14 !=
                (peVar8->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish; pCVar14 = pCVar14 + 1) {
              auVar19[0] = -(*(char *)&this_00->m_wrapped ==
                            *(char *)&(pCVar14->prevout).hash.m_wrapped.super_base_blob<256U>.m_data
                            );
              auVar19[1] = -(*(uchar *)((long)&peVar7->hash + 1) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 1));
              auVar19[2] = -(*(uchar *)((long)&peVar7->hash + 2) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 2));
              auVar19[3] = -(*(uchar *)((long)&peVar7->hash + 3) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 3));
              auVar19[4] = -(*(uchar *)((long)&peVar7->hash + 4) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 4));
              auVar19[5] = -(*(uchar *)((long)&peVar7->hash + 5) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 5));
              auVar19[6] = -(*(uchar *)((long)&peVar7->hash + 6) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 6));
              auVar19[7] = -(*(uchar *)((long)&peVar7->hash + 7) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 7));
              auVar19[8] = -(*(uchar *)((long)&peVar7->hash + 8) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 8));
              auVar19[9] = -(*(uchar *)((long)&peVar7->hash + 9) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 9));
              auVar19[10] = -(*(uchar *)((long)&peVar7->hash + 10) ==
                             *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                               super_base_blob<256U>.m_data + 10));
              auVar19[0xb] = -(*(uchar *)((long)&peVar7->hash + 0xb) ==
                              *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                                super_base_blob<256U>.m_data + 0xb));
              auVar19[0xc] = -(*(uchar *)((long)&peVar7->hash + 0xc) ==
                              *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                                super_base_blob<256U>.m_data + 0xc));
              auVar19[0xd] = -(*(uchar *)((long)&peVar7->hash + 0xd) ==
                              *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                                super_base_blob<256U>.m_data + 0xd));
              auVar19[0xe] = -(*(uchar *)((long)&peVar7->hash + 0xe) ==
                              *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                                super_base_blob<256U>.m_data + 0xe));
              auVar19[0xf] = -(*(uchar *)((long)&peVar7->hash + 0xf) ==
                              *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                                super_base_blob<256U>.m_data + 0xf));
              auVar17[0] = -(*(uchar *)((long)&peVar7->hash + 0x10) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 0x10));
              auVar17[1] = -(*(uchar *)((long)&peVar7->hash + 0x11) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 0x11));
              auVar17[2] = -(*(uchar *)((long)&peVar7->hash + 0x12) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 0x12));
              auVar17[3] = -(*(uchar *)((long)&peVar7->hash + 0x13) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 0x13));
              auVar17[4] = -(*(uchar *)((long)&peVar7->hash + 0x14) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 0x14));
              auVar17[5] = -(*(uchar *)((long)&peVar7->hash + 0x15) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 0x15));
              auVar17[6] = -(*(uchar *)((long)&peVar7->hash + 0x16) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 0x16));
              auVar17[7] = -(*(uchar *)((long)&peVar7->hash + 0x17) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 0x17));
              auVar17[8] = -(*(uchar *)((long)&peVar7->hash + 0x18) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 0x18));
              auVar17[9] = -(*(uchar *)((long)&peVar7->hash + 0x19) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 0x19));
              auVar17[10] = -(*(uchar *)((long)&peVar7->hash + 0x1a) ==
                             *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                               super_base_blob<256U>.m_data + 0x1a));
              auVar17[0xb] = -(*(uchar *)((long)&peVar7->hash + 0x1b) ==
                              *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                                super_base_blob<256U>.m_data + 0x1b));
              auVar17[0xc] = -(*(uchar *)((long)&peVar7->hash + 0x1c) ==
                              *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                                super_base_blob<256U>.m_data + 0x1c));
              auVar17[0xd] = -(*(uchar *)((long)&peVar7->hash + 0x1d) ==
                              *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                                super_base_blob<256U>.m_data + 0x1d));
              auVar17[0xe] = -(*(uchar *)((long)&peVar7->hash + 0x1e) ==
                              *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                                super_base_blob<256U>.m_data + 0x1e));
              auVar17[0xf] = -(*(uchar *)((long)&peVar7->hash + 0x1f) ==
                              *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                                super_base_blob<256U>.m_data + 0x1f));
              auVar17 = auVar17 & auVar19;
              uVar9 = (ushort)(SUB161(auVar17 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar17[0xf] >> 7) << 0xf;
              pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (ulong)uVar9;
              if (uVar9 == 0xffff) {
                base_blob<256u>::ToString_abi_cxx11_(&local_78,this_00);
                base_blob<256u>::ToString_abi_cxx11_(&local_98,this);
                tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                          (&local_58,
                           (tinyformat *)"tx %s (wtxid=%s) would exceed descendant count limit",
                           (char *)&local_78,&local_98,pbVar15);
                goto LAB_00483aba;
              }
              auVar20[0] = -((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                            (pCVar14->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                            [0]);
              auVar20[1] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                              _M_elems + 1) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 1));
              auVar20[2] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                              _M_elems + 2) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 2));
              auVar20[3] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                              _M_elems + 3) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 3));
              auVar20[4] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                              _M_elems + 4) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 4));
              auVar20[5] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                              _M_elems + 5) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 5));
              auVar20[6] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                              _M_elems + 6) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 6));
              auVar20[7] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                              _M_elems + 7) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 7));
              auVar20[8] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                              _M_elems + 8) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 8));
              auVar20[9] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                              _M_elems + 9) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 9));
              auVar20[10] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data
                                               ._M_elems + 10) ==
                             *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                               super_base_blob<256U>.m_data + 10));
              auVar20[0xb] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.
                                                m_data._M_elems + 0xb) ==
                              *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                                super_base_blob<256U>.m_data + 0xb));
              auVar20[0xc] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.
                                                m_data._M_elems + 0xc) ==
                              *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                                super_base_blob<256U>.m_data + 0xc));
              auVar20[0xd] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.
                                                m_data._M_elems + 0xd) ==
                              *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                                super_base_blob<256U>.m_data + 0xd));
              auVar20[0xe] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.
                                                m_data._M_elems + 0xe) ==
                              *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                                super_base_blob<256U>.m_data + 0xe));
              auVar20[0xf] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.
                                                m_data._M_elems + 0xf) ==
                              *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                                super_base_blob<256U>.m_data + 0xf));
              auVar18[0] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                              _M_elems + 0x10) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 0x10));
              auVar18[1] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                              _M_elems + 0x11) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 0x11));
              auVar18[2] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                              _M_elems + 0x12) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 0x12));
              auVar18[3] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                              _M_elems + 0x13) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 0x13));
              auVar18[4] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                              _M_elems + 0x14) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 0x14));
              auVar18[5] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                              _M_elems + 0x15) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 0x15));
              auVar18[6] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                              _M_elems + 0x16) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 0x16));
              auVar18[7] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                              _M_elems + 0x17) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 0x17));
              auVar18[8] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                              _M_elems + 0x18) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 0x18));
              auVar18[9] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                              _M_elems + 0x19) ==
                            *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                              super_base_blob<256U>.m_data + 0x19));
              auVar18[10] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data
                                               ._M_elems + 0x1a) ==
                             *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                               super_base_blob<256U>.m_data + 0x1a));
              auVar18[0xb] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.
                                                m_data._M_elems + 0x1b) ==
                              *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                                super_base_blob<256U>.m_data + 0x1b));
              auVar18[0xc] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.
                                                m_data._M_elems + 0x1c) ==
                              *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                                super_base_blob<256U>.m_data + 0x1c));
              auVar18[0xd] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.
                                                m_data._M_elems + 0x1d) ==
                              *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                                super_base_blob<256U>.m_data + 0x1d));
              auVar18[0xe] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.
                                                m_data._M_elems + 0x1e) ==
                              *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                                super_base_blob<256U>.m_data + 0x1e));
              auVar18[0xf] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.
                                                m_data._M_elems + 0x1f) ==
                              *(uchar *)((long)&(pCVar14->prevout).hash.m_wrapped.
                                                super_base_blob<256U>.m_data + 0x1f));
              auVar18 = auVar18 & auVar20;
              uVar9 = (ushort)(SUB161(auVar18 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar18[0xf] >> 7) << 0xf;
              pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (ulong)uVar9;
              if (uVar9 == 0xffff) {
                base_blob<256u>::ToString_abi_cxx11_(&local_78,&peVar8->hash);
                base_blob<256u>::ToString_abi_cxx11_
                          (&local_98,
                           &((psVar12->
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->m_witness_hash);
                tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                          (&local_58,(tinyformat *)"tx %s (wtxid=%s) would have too many ancestors",
                           (char *)&local_78,&local_98,pbVar15);
                goto LAB_00483aba;
              }
            }
          }
        }
        if (!bVar16) goto LAB_00483bad;
        base_blob<256u>::ToString_abi_cxx11_(&local_78,this_00);
        base_blob<256u>::ToString_abi_cxx11_(&local_98,this);
        tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                  (&local_58,(tinyformat *)"tx %s (wtxid=%s) would exceed descendant count limit",
                   (char *)&local_78,&local_98,pbVar15);
        goto LAB_00483aba;
      }
      base_blob<256u>::ToString_abi_cxx11_(&local_78,&peVar3->hash);
      base_blob<256u>::ToString_abi_cxx11_
                (&local_98,
                 &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->m_witness_hash);
      base_blob<256u>::ToString_abi_cxx11_(&local_b8,this_00);
      base_blob<256u>::ToString_abi_cxx11_((string *)(local_e0 + 8),this);
      tinyformat::
      format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (&local_58,
                 (tinyformat *)
                 "version=3 tx %s (wtxid=%s) cannot spend from non-version=3 tx %s (wtxid=%s)",
                 (char *)&local_78,&local_98,&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_e0 + 8)
                 ,in_stack_ffffffffffffff08);
LAB_00483ca9:
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload = puVar1;
      paVar2 = &local_58.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p == paVar2) {
        *puVar1 = CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                           local_58.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload + 0x18) = local_58.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = local_58._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          )._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload + 0x10) =
             CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0])
        ;
      }
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_string_length = local_58._M_string_length;
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = true;
      local_58._M_dataplus._M_p = (pointer)paVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._8_8_ != &local_c8) {
        operator_delete((void *)local_e0._8_8_,local_c8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      base_blob<256u>::ToString_abi_cxx11_(&local_78,&peVar3->hash);
      base_blob<256u>::ToString_abi_cxx11_
                (&local_98,
                 &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->m_witness_hash);
      tinyformat::format<std::__cxx11::string,std::__cxx11::string,long,long>
                (&local_58,
                 (tinyformat *)"version=3 tx %s (wtxid=%s) is too big: %u > %u virtual bytes",
                 (char *)&local_78,&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                 &TRUC_MAX_VSIZE,(long *)in_stack_ffffffffffffff08);
LAB_00483aba:
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload = puVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p == &local_58.field_2) {
        *puVar1 = CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                           local_58.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload + 0x18) = local_58.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = local_58._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          )._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload + 0x10) =
             CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0])
        ;
      }
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_string_length = local_58._M_string_length;
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = true;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    }
LAB_00483b66:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    for (p_Var10 = (mempool_ancestors->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var10 != &(mempool_ancestors->_M_t)._M_impl.super__Rb_tree_header;
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10)) {
      plVar5 = *(long **)(p_Var10 + 1);
      if (*(int *)(*plVar5 + 0x30) == 3) {
        base_blob<256u>::ToString_abi_cxx11_(&local_78,&peVar3->hash);
        base_blob<256u>::ToString_abi_cxx11_
                  (&local_98,
                   &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->m_witness_hash);
        lVar13 = *plVar5;
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[1];
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_01->_M_use_count = this_01->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_01->_M_use_count = this_01->_M_use_count + 1;
          }
        }
        base_blob<256u>::ToString_abi_cxx11_(&local_b8,(void *)(lVar13 + 0x39));
        lVar13 = *plVar5;
        this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[1];
        if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_02->_M_use_count = this_02->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_02->_M_use_count = this_02->_M_use_count + 1;
          }
        }
        base_blob<256u>::ToString_abi_cxx11_((string *)(local_e0 + 8),(void *)(lVar13 + 0x59));
        tinyformat::
        format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (&local_58,
                   (tinyformat *)
                   "non-version=3 tx %s (wtxid=%s) cannot spend from version=3 tx %s (wtxid=%s)",
                   (char *)&local_78,&local_98,&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_e0 + 8),in_stack_ffffffffffffff08);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload = puVar1;
        paVar2 = &local_58.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p == paVar2) {
          *puVar1 = CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload + 0x18) = local_58.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = local_58._M_dataplus._M_p;
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            )._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload + 0x10) =
               CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                        local_58.field_2._M_local_buf[0]);
        }
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_string_length = local_58._M_string_length;
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = true;
        local_58._M_dataplus._M_p = (pointer)paVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._8_8_ != &local_c8) {
          operator_delete((void *)local_e0._8_8_,local_c8._0_8_ + 1);
        }
        if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
        goto LAB_00483b66;
      }
    }
    if (in_stack_ffffffffffffff08 != local_f0) {
      psVar12 = (package->
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar15 = in_stack_ffffffffffffff08;
      do {
        pcVar6 = (pbVar15->_M_dataplus)._M_p;
        if ((pointer)((long)(package->
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)psVar12 >> 4) <=
            pcVar6) {
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_004843bc;
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00484126:
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_004843bc;
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0048414b:
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_004843bc;
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          goto LAB_00484170;
        }
        if ((psVar12[(long)pcVar6].
             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->version ==
            3) {
          base_blob<256u>::ToString_abi_cxx11_(&local_78,&peVar3->hash);
          base_blob<256u>::ToString_abi_cxx11_
                    (&local_98,
                     &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->m_witness_hash);
          pcVar6 = (pbVar15->_M_dataplus)._M_p;
          psVar12 = (package->
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if ((pointer)((long)(package->
                              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)psVar12 >> 4) <=
              pcVar6) goto LAB_00484126;
          base_blob<256u>::ToString_abi_cxx11_
                    (&local_b8,
                     &(psVar12[(long)pcVar6].
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      hash);
          pcVar6 = (pbVar15->_M_dataplus)._M_p;
          psVar12 = (package->
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if ((pointer)((long)(package->
                              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)psVar12 >> 4) <=
              pcVar6) goto LAB_0048414b;
          base_blob<256u>::ToString_abi_cxx11_
                    ((string *)(local_e0 + 8),
                     &(psVar12[(long)pcVar6].
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      m_witness_hash);
          tinyformat::
          format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    (&local_58,
                     (tinyformat *)
                     "non-version=3 tx %s (wtxid=%s) cannot spend from version=3 tx %s (wtxid=%s)",
                     (char *)&local_78,&local_98,&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_e0 + 8),in_stack_ffffffffffffff08);
          goto LAB_00483ca9;
        }
        pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &pbVar15->_M_string_length;
      } while (pbVar15 != local_f0);
    }
LAB_00483bad:
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
  }
  if (in_stack_ffffffffffffff08 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(in_stack_ffffffffffffff08,(long)local_e8 - (long)in_stack_ffffffffffffff08);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_004843bc:
  __stack_chk_fail();
}

Assistant:

std::optional<std::string> PackageTRUCChecks(const CTransactionRef& ptx, int64_t vsize,
                                           const Package& package,
                                           const CTxMemPool::setEntries& mempool_ancestors)
{
    // This function is specialized for these limits, and must be reimplemented if they ever change.
    static_assert(TRUC_ANCESTOR_LIMIT == 2);
    static_assert(TRUC_DESCENDANT_LIMIT == 2);

    const auto in_package_parents{FindInPackageParents(package, ptx)};

    // Now we have all ancestors, so we can start checking TRUC rules.
    if (ptx->version == TRUC_VERSION) {
        // SingleTRUCChecks should have checked this already.
        if (!Assume(vsize <= TRUC_MAX_VSIZE)) {
            return strprintf("version=3 tx %s (wtxid=%s) is too big: %u > %u virtual bytes",
                             ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString(), vsize, TRUC_MAX_VSIZE);
        }

        if (mempool_ancestors.size() + in_package_parents.size() + 1 > TRUC_ANCESTOR_LIMIT) {
            return strprintf("tx %s (wtxid=%s) would have too many ancestors",
                             ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString());
        }

        const bool has_parent{mempool_ancestors.size() + in_package_parents.size() > 0};
        if (has_parent) {
            // A TRUC child cannot be too large.
            if (vsize > TRUC_CHILD_MAX_VSIZE) {
                return strprintf("version=3 child tx %s (wtxid=%s) is too big: %u > %u virtual bytes",
                                 ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString(),
                                 vsize, TRUC_CHILD_MAX_VSIZE);
            }

            // Exactly 1 parent exists, either in mempool or package. Find it.
            const auto parent_info = [&] {
                if (mempool_ancestors.size() > 0) {
                    auto& mempool_parent = *mempool_ancestors.begin();
                    return ParentInfo{mempool_parent->GetTx().GetHash(),
                                      mempool_parent->GetTx().GetWitnessHash(),
                                      mempool_parent->GetTx().version,
                                      /*has_mempool_descendant=*/mempool_parent->GetCountWithDescendants() > 1};
                } else {
                    auto& parent_index = in_package_parents.front();
                    auto& package_parent = package.at(parent_index);
                    return ParentInfo{package_parent->GetHash(),
                                      package_parent->GetWitnessHash(),
                                      package_parent->version,
                                      /*has_mempool_descendant=*/false};
                }
            }();

            // If there is a parent, it must have the right version.
            if (parent_info.m_version != TRUC_VERSION) {
                return strprintf("version=3 tx %s (wtxid=%s) cannot spend from non-version=3 tx %s (wtxid=%s)",
                                 ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString(),
                                 parent_info.m_txid.ToString(), parent_info.m_wtxid.ToString());
            }

            for (const auto& package_tx : package) {
                // Skip same tx.
                if (&(*package_tx) == &(*ptx)) continue;

                for (auto& input : package_tx->vin) {
                    // Fail if we find another tx with the same parent. We don't check whether the
                    // sibling is to-be-replaced (done in SingleTRUCChecks) because these transactions
                    // are within the same package.
                    if (input.prevout.hash == parent_info.m_txid) {
                        return strprintf("tx %s (wtxid=%s) would exceed descendant count limit",
                                         parent_info.m_txid.ToString(),
                                         parent_info.m_wtxid.ToString());
                    }

                    // This tx can't have both a parent and an in-package child.
                    if (input.prevout.hash == ptx->GetHash()) {
                        return strprintf("tx %s (wtxid=%s) would have too many ancestors",
                                         package_tx->GetHash().ToString(), package_tx->GetWitnessHash().ToString());
                    }
                }
            }

            if (parent_info.m_has_mempool_descendant) {
                return strprintf("tx %s (wtxid=%s) would exceed descendant count limit",
                                parent_info.m_txid.ToString(), parent_info.m_wtxid.ToString());
            }
        }
    } else {
        // Non-TRUC transactions cannot have TRUC parents.
        for (auto it : mempool_ancestors) {
            if (it->GetTx().version == TRUC_VERSION) {
                return strprintf("non-version=3 tx %s (wtxid=%s) cannot spend from version=3 tx %s (wtxid=%s)",
                                 ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString(),
                                 it->GetSharedTx()->GetHash().ToString(), it->GetSharedTx()->GetWitnessHash().ToString());
            }
        }
        for (const auto& index: in_package_parents) {
            if (package.at(index)->version == TRUC_VERSION) {
                return strprintf("non-version=3 tx %s (wtxid=%s) cannot spend from version=3 tx %s (wtxid=%s)",
                                 ptx->GetHash().ToString(),
                                 ptx->GetWitnessHash().ToString(),
                                 package.at(index)->GetHash().ToString(),
                                 package.at(index)->GetWitnessHash().ToString());
            }
        }
    }
    return std::nullopt;
}